

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper_test.cpp
# Opt level: O3

void __thiscall disp::get_6(disp *this,int a,int b,int c,int d,int e,int f)

{
  undefined8 *puVar1;
  long *plVar2;
  undefined8 *puVar3;
  ulong *puVar4;
  ulong uVar5;
  undefined8 uVar6;
  ulong *local_1b0;
  long local_1a8;
  ulong local_1a0;
  undefined8 uStack_198;
  ulong *local_190;
  long local_188;
  ulong local_180;
  undefined8 uStack_178;
  ulong *local_170;
  long local_168;
  ulong local_160;
  undefined8 uStack_158;
  ulong *local_150;
  long local_148;
  ulong local_140;
  undefined8 uStack_138;
  ulong *local_130;
  long local_128;
  ulong local_120;
  long lStack_118;
  undefined8 *local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  ts<int>(&local_50,a);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x132e05);
  puVar4 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar4) {
    local_120 = *puVar4;
    lStack_118 = plVar2[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar4;
    local_130 = (ulong *)*plVar2;
  }
  local_128 = plVar2[1];
  *plVar2 = (long)puVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  ts<int>(&local_70,b);
  uVar5 = 0xf;
  if (local_130 != &local_120) {
    uVar5 = local_120;
  }
  if (uVar5 < local_70._M_string_length + local_128) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      uVar6 = local_70.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar6 < local_70._M_string_length + local_128) goto LAB_00128c9e;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_00128c9e:
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_70._M_dataplus._M_p);
  }
  local_1b0 = &local_1a0;
  puVar4 = puVar3 + 2;
  if ((ulong *)*puVar3 == puVar4) {
    local_1a0 = *puVar4;
    uStack_198 = puVar3[3];
  }
  else {
    local_1a0 = *puVar4;
    local_1b0 = (ulong *)*puVar3;
  }
  local_1a8 = puVar3[1];
  *puVar3 = puVar4;
  puVar3[1] = 0;
  *(undefined1 *)puVar4 = 0;
  ts<int>(&local_90,c);
  uVar5 = 0xf;
  if (local_1b0 != &local_1a0) {
    uVar5 = local_1a0;
  }
  if (uVar5 < local_90._M_string_length + local_1a8) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      uVar6 = local_90.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar6 < local_90._M_string_length + local_1a8) goto LAB_00128d6b;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_1b0);
  }
  else {
LAB_00128d6b:
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_1b0,(ulong)local_90._M_dataplus._M_p);
  }
  local_190 = &local_180;
  puVar4 = puVar3 + 2;
  if ((ulong *)*puVar3 == puVar4) {
    local_180 = *puVar4;
    uStack_178 = puVar3[3];
  }
  else {
    local_180 = *puVar4;
    local_190 = (ulong *)*puVar3;
  }
  local_188 = puVar3[1];
  *puVar3 = puVar4;
  puVar3[1] = 0;
  *(undefined1 *)puVar4 = 0;
  ts<int>(&local_b0,d);
  uVar5 = 0xf;
  if (local_190 != &local_180) {
    uVar5 = local_180;
  }
  if (uVar5 < local_b0._M_string_length + local_188) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      uVar6 = local_b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar6 < local_b0._M_string_length + local_188) goto LAB_00128e33;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_190);
  }
  else {
LAB_00128e33:
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_190,(ulong)local_b0._M_dataplus._M_p);
  }
  local_170 = &local_160;
  puVar4 = puVar3 + 2;
  if ((ulong *)*puVar3 == puVar4) {
    local_160 = *puVar4;
    uStack_158 = puVar3[3];
  }
  else {
    local_160 = *puVar4;
    local_170 = (ulong *)*puVar3;
  }
  local_168 = puVar3[1];
  *puVar3 = puVar4;
  puVar3[1] = 0;
  *(undefined1 *)puVar4 = 0;
  ts<int>(&local_d0,e);
  uVar5 = 0xf;
  if (local_170 != &local_160) {
    uVar5 = local_160;
  }
  if (uVar5 < local_d0._M_string_length + local_168) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      uVar6 = local_d0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar6 < local_d0._M_string_length + local_168) goto LAB_00128efa;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_170);
  }
  else {
LAB_00128efa:
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_170,(ulong)local_d0._M_dataplus._M_p);
  }
  local_150 = &local_140;
  puVar4 = puVar3 + 2;
  if ((ulong *)*puVar3 == puVar4) {
    local_140 = *puVar4;
    uStack_138 = puVar3[3];
  }
  else {
    local_140 = *puVar4;
    local_150 = (ulong *)*puVar3;
  }
  local_148 = puVar3[1];
  *puVar3 = puVar4;
  puVar3[1] = 0;
  *(undefined1 *)puVar4 = 0;
  ts<int>(&local_f0,f);
  uVar5 = 0xf;
  if (local_150 != &local_140) {
    uVar5 = local_140;
  }
  if (uVar5 < local_f0._M_string_length + local_148) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      uVar6 = local_f0.field_2._M_allocated_capacity;
    }
    if (local_f0._M_string_length + local_148 <= (ulong)uVar6) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_150);
      goto LAB_00128fe3;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_f0._M_dataplus._M_p);
LAB_00128fe3:
  local_110 = &local_100;
  puVar1 = puVar3 + 2;
  if ((undefined8 *)*puVar3 == puVar1) {
    local_100 = *puVar1;
    uStack_f8 = puVar3[3];
  }
  else {
    local_100 = *puVar1;
    local_110 = (undefined8 *)*puVar3;
  }
  local_108 = puVar3[1];
  *puVar3 = puVar1;
  puVar3[1] = 0;
  *(undefined1 *)puVar1 = 0;
  std::__cxx11::string::operator=((string *)&this->v_,(string *)&local_110);
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void get_6(int a,int b,int c,int d,int e,int f) { v_="get_6" + ts(a)+ts(b)+ts(c)+ts(d)+ts(e)+ts(f); }